

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdkanji.c
# Opt level: O0

int any2eucjp(uchar *dest,uchar *src,uint dest_max)

{
  size_t sVar1;
  int ret;
  uint dest_max_local;
  uchar *src_local;
  uchar *dest_local;
  
  sVar1 = strlen((char *)src);
  if (sVar1 < 0x2000) {
    if (dest_max < 0x2001) {
      dest_local._4_4_ = do_check_and_conv(any2eucjp::tmp_dest,src);
      sVar1 = strlen((char *)any2eucjp::tmp_dest);
      if (sVar1 < dest_max) {
        strcpy((char *)dest,(char *)any2eucjp::tmp_dest);
      }
      else {
        gd_error("output buffer overflow");
        strcpy((char *)dest,(char *)src);
        dest_local._4_4_ = -1;
      }
    }
    else {
      gd_error("invalid maximum size of destination\nit should be less than %d.",0x2000);
      dest_local._4_4_ = -1;
    }
  }
  else {
    gd_error("input string too large");
    dest_local._4_4_ = -1;
  }
  return dest_local._4_4_;
}

Assistant:

int
any2eucjp (unsigned char *dest, unsigned char *src, unsigned int dest_max)
{
	static unsigned char tmp_dest[BUFSIZ];
	int ret;

	if (strlen ((const char *) src) >= BUFSIZ) {
		gd_error("input string too large");
		return -1;
	}
	if (dest_max > BUFSIZ) {
		gd_error
		("invalid maximum size of destination\nit should be less than %d.",
		 BUFSIZ);
		return -1;
	}
	ret = do_check_and_conv (tmp_dest, src);
	if (strlen ((const char *) tmp_dest) >= dest_max) {
		gd_error("output buffer overflow");
		ustrcpy (dest, src);
		return -1;
	}
	ustrcpy (dest, tmp_dest);
	return ret;
}